

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

_Bool pmsav7_use_background_region(ARMCPU_conflict1 *cpu,ARMMMUIdx mmu_idx,_Bool is_user)

{
  _Bool _Var1;
  int iVar2;
  CPUARMState_conflict *env_00;
  uint64_t uVar3;
  CPUARMState_conflict *env;
  _Bool is_user_local;
  ARMMMUIdx mmu_idx_local;
  ARMCPU_conflict1 *cpu_local;
  
  env_00 = &cpu->env;
  if (is_user) {
    cpu_local._7_1_ = false;
  }
  else {
    iVar2 = arm_feature(env_00,9);
    if (iVar2 == 0) {
      uVar3 = regime_sctlr(env_00,mmu_idx);
      cpu_local._7_1_ = (uVar3 & 0x20000) != 0;
    }
    else {
      _Var1 = regime_is_secure(env_00,mmu_idx);
      cpu_local._7_1_ = ((cpu->env).v7m.mpu_ctrl[_Var1] & 4) != 0;
    }
  }
  return cpu_local._7_1_;
}

Assistant:

static bool pmsav7_use_background_region(ARMCPU *cpu,
                                         ARMMMUIdx mmu_idx, bool is_user)
{
    /* Return true if we should use the default memory map as a
     * "background" region if there are no hits against any MPU regions.
     */
    CPUARMState *env = &cpu->env;

    if (is_user) {
        return false;
    }

    if (arm_feature(env, ARM_FEATURE_M)) {
        return env->v7m.mpu_ctrl[regime_is_secure(env, mmu_idx)]
            & R_V7M_MPU_CTRL_PRIVDEFENA_MASK;
    } else {
        return regime_sctlr(env, mmu_idx) & SCTLR_BR;
    }
}